

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

void mbedtls_x509_crt_free(mbedtls_x509_crt *crt)

{
  mbedtls_x509_crt **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_asn1_sequence *pmVar3;
  size_t sVar4;
  mbedtls_asn1_named_data *pmVar5;
  mbedtls_asn1_sequence *pmVar6;
  long lVar7;
  size_t sVar8;
  mbedtls_x509_crt *cert_cur;
  uchar *__ptr;
  mbedtls_x509_crt *pmVar9;
  mbedtls_x509_crt *__ptr_00;
  
  pmVar9 = crt;
  if (crt != (mbedtls_x509_crt *)0x0) {
    do {
      mbedtls_pk_free(&pmVar9->pk);
      free(pmVar9->sig_opts);
      pmVar5 = (pmVar9->issuer).next;
      while (pmVar5 != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = pmVar5->next;
        lVar7 = 0;
        do {
          *(undefined1 *)((long)&(pmVar5->oid).tag + lVar7) = 0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x40);
        free(pmVar5);
        pmVar5 = pmVar2;
      }
      pmVar5 = (pmVar9->subject).next;
      while (pmVar5 != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = pmVar5->next;
        lVar7 = 0;
        do {
          *(undefined1 *)((long)&(pmVar5->oid).tag + lVar7) = 0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x40);
        free(pmVar5);
        pmVar5 = pmVar2;
      }
      pmVar6 = (pmVar9->ext_key_usage).next;
      while (pmVar6 != (mbedtls_asn1_sequence *)0x0) {
        pmVar3 = pmVar6->next;
        lVar7 = 0;
        do {
          *(undefined1 *)((long)&(pmVar6->buf).tag + lVar7) = 0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        free(pmVar6);
        pmVar6 = pmVar3;
      }
      pmVar6 = (pmVar9->subject_alt_names).next;
      while (pmVar6 != (mbedtls_asn1_sequence *)0x0) {
        pmVar3 = pmVar6->next;
        lVar7 = 0;
        do {
          *(undefined1 *)((long)&(pmVar6->buf).tag + lVar7) = 0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x20);
        free(pmVar6);
        pmVar6 = pmVar3;
      }
      __ptr = (pmVar9->raw).p;
      if (__ptr != (uchar *)0x0) {
        sVar4 = (pmVar9->raw).len;
        if (sVar4 != 0) {
          sVar8 = 0;
          do {
            __ptr[sVar8] = '\0';
            sVar8 = sVar8 + 1;
          } while (sVar4 != sVar8);
          __ptr = (pmVar9->raw).p;
        }
        free(__ptr);
      }
      ppmVar1 = &pmVar9->next;
      __ptr_00 = crt;
      pmVar9 = *ppmVar1;
    } while (*ppmVar1 != (mbedtls_x509_crt *)0x0);
    do {
      pmVar9 = __ptr_00->next;
      lVar7 = 0;
      do {
        *(undefined1 *)((long)&(__ptr_00->raw).tag + lVar7) = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x228);
      if (__ptr_00 != crt) {
        free(__ptr_00);
      }
      __ptr_00 = pmVar9;
    } while (pmVar9 != (mbedtls_x509_crt *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crt_free( mbedtls_x509_crt *crt )
{
    mbedtls_x509_crt *cert_cur = crt;
    mbedtls_x509_crt *cert_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_sequence *seq_cur;
    mbedtls_x509_sequence *seq_prv;

    if( crt == NULL )
        return;

    do
    {
        mbedtls_pk_free( &cert_cur->pk );

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( cert_cur->sig_opts );
#endif

        name_cur = cert_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        name_cur = cert_cur->subject.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        seq_cur = cert_cur->ext_key_usage.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        seq_cur = cert_cur->subject_alt_names.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        if( cert_cur->raw.p != NULL )
        {
            mbedtls_zeroize( cert_cur->raw.p, cert_cur->raw.len );
            mbedtls_free( cert_cur->raw.p );
        }

        cert_cur = cert_cur->next;
    }
    while( cert_cur != NULL );

    cert_cur = crt;
    do
    {
        cert_prv = cert_cur;
        cert_cur = cert_cur->next;

        mbedtls_zeroize( cert_prv, sizeof( mbedtls_x509_crt ) );
        if( cert_prv != crt )
            mbedtls_free( cert_prv );
    }
    while( cert_cur != NULL );
}